

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O1

timeType __thiscall sjtu::timeType::operator+(timeType *this,int *time)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  ulong uVar4;
  uint *puVar5;
  timeType *ret;
  uint uVar6;
  int iVar7;
  timeType tVar8;
  
  this->month = 0;
  this->day = 0;
  this->hour = 0;
  this->minute = 0;
  iVar2 = *in_RDX + time[3];
  this->minute = iVar2;
  iVar3 = iVar2 / 0x3c + time[2];
  this->minute = iVar2 % 0x3c;
  iVar7 = iVar3 / 0x18;
  this->hour = iVar3 % 0x18;
  iVar3 = time[1];
  this->day = iVar3;
  uVar1 = *time;
  uVar4 = (ulong)uVar1;
  iVar2 = iVar3 + iVar7;
  uVar6 = *(uint *)(months + (long)(int)uVar1 * 4);
  if ((int)uVar6 < iVar2) {
    puVar5 = (uint *)(months + (long)(int)uVar1 * 4);
    do {
      puVar5 = puVar5 + 1;
      iVar2 = (iVar7 + iVar3) - uVar6;
      iVar7 = ~uVar6 + iVar7 + iVar3;
      uVar6 = *puVar5;
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar3 = 1;
    } while ((int)uVar6 < iVar2);
  }
  this->month = (int)uVar4;
  this->day = iVar2;
  tVar8.hour = (int)uVar4;
  tVar8.minute = (int)(uVar4 >> 0x20);
  tVar8._0_8_ = this;
  return tVar8;
}

Assistant:

timeType timeType::operator+(const int &time) const {
        	timeType ret;
                ret.minute = minute + time , ret.hour = hour + ret.minute / 60 , ret.minute %= 60;
                int day_add = ret.hour / 24;ret.hour %= 24;
                for (ret.day = day , ret.month = month;day_add + ret.day > months[ret.month];++ ret.month) day_add -= months[ret.month] - ret.day + 1 , ret.day = 1;
                ret.day += day_add;
        	return ret;
        }